

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

string * __thiscall
clipp::usage_lines::param_label_abi_cxx11_
          (string *__return_storage_ptr__,usage_lines *this,parameter *p,context *cur)

{
  uint uVar1;
  group *pgVar2;
  pointer pbVar3;
  pointer pbVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  undefined7 extraout_var;
  group *pgVar8;
  undefined7 extraout_var_00;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  byte bVar12;
  string lbl;
  pointer local_a8;
  size_type local_a0;
  char local_98;
  undefined7 uStack_97;
  undefined8 uStack_90;
  undefined8 local_88;
  uint local_7c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pgVar2 = (cur->pos).stack_.
           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].parent;
  lVar7 = (long)(pgVar2->children_).
                super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(pgVar2->children_).
                super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (uint)CONCAT71((int7)((ulong)(lVar7 % 0x108) >> 8),1);
  pgVar8 = pgVar2;
  if ((1 < (ulong)(lVar7 / 0x108)) && ((p->super_token<clipp::parameter>).blocking_ == true)) {
    bVar5 = group::depth_first_traverser::is_first_in_parent(&cur->pos);
    uVar6 = (uint)CONCAT71(extraout_var,bVar5) ^ 1;
    pgVar8 = (cur->pos).stack_.
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].parent;
  }
  bVar12 = this->ommitOutermostSurrounders_ ^ 1U | cur->outermost != pgVar2;
  if (pgVar8->exclusive_ == false) {
    uVar6 = CONCAT31((int3)(uVar6 >> 8),(byte)uVar6 & (p->required_ ^ 1U) & bVar12);
  }
  else {
    uVar6 = 0;
  }
  bVar12 = bVar12 & (p->super_token<clipp::parameter>).repeatable_;
  local_a8 = &local_98;
  local_a0 = 0;
  local_98 = '\0';
  if (bVar12 == 1) {
    std::__cxx11::string::append((string *)&local_a8);
  }
  if ((char)uVar6 != '\0') {
    std::__cxx11::string::append((string *)&local_a8);
  }
  pbVar3 = (p->flags_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (p->flags_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar3 == pbVar4) {
    if ((p->label_)._M_string_length == 0) {
      if ((this->fmt_).emptyLabel_._M_string_length == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_78);
        goto LAB_0010e332;
      }
      std::operator+(&local_50,&(this->fmt_).labelPre_,&(this->fmt_).emptyLabel_);
      std::operator+(&local_78,&local_50,&(this->fmt_).labelPst_);
      std::__cxx11::string::append((string *)&local_a8);
    }
    else {
      std::operator+(&local_50,&(this->fmt_).labelPre_,&p->label_);
      std::operator+(&local_78,&local_50,&(this->fmt_).labelPst_);
      std::__cxx11::string::append((string *)&local_a8);
    }
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    uVar1 = (this->fmt_).maxAltInUsage_;
    uVar10 = (uint)((ulong)((long)pbVar4 - (long)pbVar3) >> 5);
    if ((int)uVar1 < (int)uVar10) {
      uVar10 = uVar1;
    }
    uVar9 = 0;
    local_88 = 0;
    local_7c = uVar6;
    if (1 < (int)uVar10 && (uVar6 & 1) == 0) {
      bVar5 = context::is_singleton(cur);
      if (bVar5) {
        local_88 = 0;
      }
      else {
        local_88 = CONCAT71(extraout_var_00,1);
        std::__cxx11::string::append((string *)&local_a8);
      }
    }
    uVar11 = (ulong)uVar10;
    if ((int)uVar10 < 1) {
      uVar11 = uVar9;
    }
    bVar5 = false;
    local_58 = __return_storage_ptr__;
    for (; __return_storage_ptr__ = local_58, uVar6 = local_7c, uVar11 * 0x20 != uVar9;
        uVar9 = uVar9 + 0x20) {
      if (bVar5) {
        context::is_singleton(cur);
        std::__cxx11::string::append((string *)&local_a8);
      }
      std::__cxx11::string::append((string *)&local_a8);
      bVar5 = true;
    }
    if ((char)local_88 != '\0') {
      std::__cxx11::string::append((string *)&local_a8);
    }
  }
  if ((char)uVar6 != '\0') {
    std::__cxx11::string::append((string *)&local_a8);
  }
  if (bVar12 != 0) {
    std::__cxx11::string::append((string *)&local_a8);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_a8 == &local_98) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_97,local_98);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_90;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_a8;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_97,local_98);
  }
  __return_storage_ptr__->_M_string_length = local_a0;
  local_a0 = 0;
  local_98 = '\0';
  local_a8 = &local_98;
LAB_0010e332:
  std::__cxx11::string::~string((string *)&local_a8);
  return __return_storage_ptr__;
}

Assistant:

string param_label(const parameter& p, const context& cur) const
    {
        const auto& parent = cur.pos.parent();

        const bool startsOptionalSequence =
            parent.size() > 1 && p.blocking() && cur.pos.is_first_in_parent();

        const bool outermost =
            ommitOutermostSurrounders_ && cur.outermost == &parent;

        const bool showopt = !cur.is_alternative() && !p.required()
            && !startsOptionalSequence && !outermost;

        const bool showrep = p.repeatable() && !outermost;

        string lbl;

        if(showrep) lbl += fmt_.repeat_prefix();
        if(showopt) lbl += fmt_.optional_prefix();

        const auto& flags = p.flags();
        if(!flags.empty()) {
            const int n = std::min(fmt_.max_flags_per_param_in_usage(),
                                   int(flags.size()));

            const bool surrAlt = n > 1 && !showopt && !cur.is_singleton();

            if(surrAlt) lbl += fmt_.alternative_flags_prefix();
            bool sep = false;
            for(int i = 0; i < n; ++i) {
                if(sep) {
                    if(cur.is_singleton())
                        lbl += fmt_.alternative_group_separator();
                    else
                        lbl += fmt_.flag_separator();
                }
                lbl += flags[i];
                sep = true;
            }
            if(surrAlt) lbl += fmt_.alternative_flags_postfix();
        }
        else {
             if(!p.label().empty()) {
                 lbl += fmt_.label_prefix()
                     + p.label()
                     + fmt_.label_postfix();
             } else if(!fmt_.empty_label().empty()) {
                 lbl += fmt_.label_prefix()
                     + fmt_.empty_label()
                     + fmt_.label_postfix();
             } else {
                 return "";
             }
        }

        if(showopt) lbl += fmt_.optional_postfix();
        if(showrep) lbl += fmt_.repeat_postfix();

        return lbl;
    }